

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_candle(obj **optr)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  obj *obj_00;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char local_b8 [8];
  char qbuf [128];
  char *s;
  obj *otmp;
  obj *obj;
  obj **optr_local;
  
  otmp = *optr;
  pcVar3 = "candle";
  if (otmp->quan != 1) {
    pcVar3 = "candles";
  }
  if ((u._1052_1_ & 1) == 0) {
    obj_00 = carrying(0x10b);
    if ((obj_00 == (obj *)0x0) || (obj_00->spe == '\a')) {
      if (((byte)u._1052_1_ >> 1 & 1) == 0) {
        optr_local._4_4_ = use_lamp(otmp);
      }
      else {
        pline("Sorry, fire and water don\'t mix.");
        optr_local._4_4_ = 0;
      }
    }
    else {
      pcVar4 = xname(otmp);
      pcVar4 = the(pcVar4);
      sprintf(local_b8,"Attach %s",pcVar4);
      pcVar4 = eos(local_b8);
      pcVar5 = xname(obj_00);
      pcVar5 = the(pcVar5);
      pcVar6 = simple_typename((int)obj_00->otyp);
      pcVar6 = the(pcVar6);
      pcVar5 = safe_qbuf(local_b8,6,pcVar5,pcVar6,"it");
      sprintf(pcVar4," to %s?",pcVar5);
      cVar1 = yn_function(local_b8,"yn",'n');
      if (cVar1 == 'n') {
        if (((byte)u._1052_1_ >> 1 & 1) == 0) {
          if ((*(uint *)&otmp->field_0x4a >> 0x13 & 1) == 0) {
            pcVar3 = xname(otmp);
            pcVar3 = the(pcVar3);
            pline("You try to light %s...",pcVar3);
          }
          optr_local._4_4_ = use_lamp(otmp);
        }
        else {
          pline("Sorry, fire and water don\'t mix.");
          optr_local._4_4_ = 0;
        }
      }
      else {
        if ((long)obj_00->spe + (long)otmp->quan < 8) {
          *optr = (obj *)0x0;
        }
        else {
          otmp = splitobj(otmp,7 - (long)obj_00->spe);
        }
        uVar2 = otmp->quan;
        pcVar4 = " more";
        if (obj_00->spe == '\0') {
          pcVar4 = "";
        }
        pcVar5 = xname(obj_00);
        pcVar5 = the(pcVar5);
        pline("You attach %ld%s %s to %s.",(ulong)uVar2,pcVar4,pcVar3,pcVar5);
        if ((obj_00->spe == '\0') || (otmp->age < obj_00->age)) {
          obj_00->age = otmp->age;
        }
        obj_00->spe = obj_00->spe + (char)otmp->quan;
        if (((*(uint *)&obj_00->field_0x4a >> 0x13 & 1) == 0) ||
           ((*(uint *)&otmp->field_0x4a >> 0x13 & 1) != 0)) {
          if (((*(uint *)&obj_00->field_0x4a >> 0x13 & 1) == 0) &&
             ((*(uint *)&otmp->field_0x4a >> 0x13 & 1) != 0)) {
            pcVar3 = "It goes";
            if (1 < otmp->quan) {
              pcVar3 = "They go";
            }
            pline("%s out.",pcVar3);
          }
        }
        else {
          pcVar4 = vtense(pcVar3,"ignite");
          pline("The new %s magically %s!",pcVar3,pcVar4);
        }
        if ((*(uint *)&otmp->field_0x4a >> 2 & 1) != 0) {
          pcVar3 = "use";
          if ((*(uint *)&obj_00->field_0x4a >> 0x13 & 1) != 0) {
            pcVar3 = "burn";
          }
          pcVar4 = "it";
          if (1 < otmp->quan) {
            pcVar4 = "them";
          }
          pcVar5 = "it";
          if (1 < otmp->quan) {
            pcVar5 = "them";
          }
          verbalize("You %s %s, you bought %s!",pcVar3,pcVar4,pcVar5);
        }
        if ((otmp->quan < 7) && (obj_00->spe == '\a')) {
          pcVar3 = xname(obj_00);
          pcVar3 = The(pcVar3);
          pcVar4 = "";
          if ((*(uint *)&obj_00->field_0x4a >> 0x13 & 1) != 0) {
            pcVar4 = " lit";
          }
          pline("%s now has seven%s candles attached.",pcVar3,pcVar4);
        }
        if ((*(uint *)&obj_00->field_0x4a >> 0x13 & 1) != 0) {
          obj_merge_light_sources(obj_00,obj_00);
        }
        if ((*(uint *)&otmp->field_0x4a >> 0x13 & 1) != 0) {
          end_burn(otmp,'\x01');
        }
        useupall(otmp);
        uVar2 = weight(obj_00);
        obj_00->owt = uVar2;
        optr_local._4_4_ = 1;
      }
    }
  }
  else {
    pline("You don\'t have enough elbow-room to maneuver.");
    optr_local._4_4_ = 0;
  }
  return optr_local._4_4_;
}

Assistant:

static int use_candle(struct obj **optr)
{
	struct obj *obj = *optr;
	struct obj *otmp;
	const char *s = (obj->quan != 1) ? "candles" : "candle";
	char qbuf[QBUFSZ];

	if (u.uswallow) {
		pline(no_elbow_room);
		return 0;
	}
	
	otmp = carrying(CANDELABRUM_OF_INVOCATION);
	if (!otmp || otmp->spe == 7) {
		if (Underwater) {
		    pline("Sorry, fire and water don't mix.");
		    return 0;
		}
		return use_lamp(obj);
	}

	sprintf(qbuf, "Attach %s", the(xname(obj)));
	sprintf(eos(qbuf), " to %s?",
		safe_qbuf(qbuf, sizeof(" to ?"), the(xname(otmp)),
			the(simple_typename(otmp->otyp)), "it"));
	if (yn(qbuf) == 'n') {
		if (Underwater) {
		    pline("Sorry, fire and water don't mix.");
		    return 0;
		}
		if (!obj->lamplit)
		    pline("You try to light %s...", the(xname(obj)));
		return use_lamp(obj);
	} else {
		if ((long)otmp->spe + obj->quan > 7L)
		    obj = splitobj(obj, 7L - (long)otmp->spe);
		else *optr = 0;
		pline("You attach %ld%s %s to %s.",
		    obj->quan, !otmp->spe ? "" : " more",
		    s, the(xname(otmp)));
		if (!otmp->spe || otmp->age > obj->age)
		    otmp->age = obj->age;
		otmp->spe += (int)obj->quan;
		if (otmp->lamplit && !obj->lamplit)
		    pline("The new %s magically %s!", s, vtense(s, "ignite"));
		else if (!otmp->lamplit && obj->lamplit)
		    pline("%s out.", (obj->quan > 1L) ? "They go" : "It goes");
		if (obj->unpaid)
		    verbalize("You %s %s, you bought %s!",
			      otmp->lamplit ? "burn" : "use",
			      (obj->quan > 1L) ? "them" : "it",
			      (obj->quan > 1L) ? "them" : "it");
		if (obj->quan < 7L && otmp->spe == 7)
		    pline("%s now has seven%s candles attached.",
			  The(xname(otmp)), otmp->lamplit ? " lit" : "");
		/* candelabrum's light range might increase */
		if (otmp->lamplit) obj_merge_light_sources(otmp, otmp);
		/* candles are no longer a separate light source */
		if (obj->lamplit) end_burn(obj, TRUE);
		/* candles are now gone */
		useupall(obj);
		otmp->owt = weight(otmp);
		/* no encumber_msg: weight on player didn't change */
	}
	return 1;
}